

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseData.cpp
# Opt level: O0

bool __thiscall
SGParser::Generator::StdGrammarParseData::CreateSymbolMap
          (StdGrammarParseData *this,StdGrammarParseHandler *data,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *symbols,vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                   *productions,vector<unsigned_int,_std::allocator<unsigned_int>_> *startSymbols)

{
  pointer *ppuVar1;
  char cVar2;
  size_t sVar3;
  _Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Var4;
  value_type *pvVar5;
  mapped_type_conflict1 mVar6;
  uint uVar7;
  bool bVar8;
  size_type sVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  char *pcVar11;
  undefined1 *puVar12;
  undefined8 uVar13;
  mapped_type *pmVar14;
  mapped_type *pmVar15;
  value_type *pvVar16;
  mapped_type *pmVar17;
  reference puVar18;
  set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *psVar19;
  iterator __first;
  iterator __last;
  undefined1 *puVar20;
  reference pvVar21;
  uint *puVar22;
  reference pvVar23;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar24;
  mapped_type_conflict1 *pmVar25;
  undefined8 uVar26;
  pointer ppVar27;
  uint *local_748;
  uint local_724;
  _Self local_4d8;
  _Self local_4d0;
  iterator inonTerminals;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *symbol_3;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  size_t ichain;
  uint *rght;
  size_t ileft_1;
  _Self local_488;
  _Self local_480;
  uint local_474;
  _Self local_470;
  _Self local_468;
  reference local_460;
  value_type *symbol_2;
  size_t ileft;
  vector<unsigned_int,_std::allocator<unsigned_int>_> leftSymbolErrorTerminal;
  vector<unsigned_int,_std::allocator<unsigned_int>_> leftSymbolId;
  uint local_40c;
  iterator iStack_408;
  uint nonterm_1;
  iterator __end4;
  iterator __begin4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  _Self local_3e8;
  string local_3e0 [32];
  uint *local_3c0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_3b8;
  uint local_3ac;
  iterator iStack_3a8;
  uint nonterm;
  iterator __end6;
  iterator __begin6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range6;
  _Self local_388;
  _Self local_380;
  _Self local_378;
  string local_370 [32];
  string local_350 [32];
  reference local_330;
  value_type *symbol_1;
  size_t ireduce;
  vector<unsigned_int,_std::allocator<unsigned_int>_> terminalIds;
  vector<unsigned_int,_std::allocator<unsigned_int>_> nonTerminalIds;
  _Self local_2e8;
  _Self local_2e0;
  _Self local_2d8;
  _Self local_2d0;
  _Self local_2c8;
  _Self local_2c0;
  _Self local_2b8;
  key_type local_2ac;
  mapped_type *local_2a8;
  ConflictAction *action;
  _Self local_298;
  undefined1 local_290 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  size_type index;
  uint id;
  bool conflictActionsError;
  _Self local_258;
  _Self local_250;
  _Self local_248;
  _Self local_240;
  _Self local_238;
  string local_230 [32];
  string local_210 [32];
  reference local_1f0;
  value_type *symbol;
  bool prec;
  mapped_type_conflict1 local_1d8;
  size_t line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *right;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *left;
  size_t iright;
  uint local_1b0;
  uint uStack_1ac;
  bool reduceValue;
  uint precValue;
  uint symbolId;
  map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  reduceData;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rhs;
  Production p;
  ProductionData *prod;
  iterator __end2;
  iterator __begin2;
  vector<SGParser::Generator::StdGrammarParseHandler::ProductionData,_std::allocator<SGParser::Generator::StdGrammarParseHandler::ProductionData>_>
  *__range2;
  uint terminalIdCounter;
  uint idCounter;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  nonTerminals;
  anon_class_16_2_e3ac8062 checkForErrorAndReport;
  size_t errorCount;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *startSymbols_local;
  vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
  *productions_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *symbols_local;
  StdGrammarParseHandler *data_local;
  StdGrammarParseData *this_local;
  
  checkForErrorAndReport.errorCount = (size_t *)0x0;
  checkForErrorAndReport.this = (StdGrammarParseData *)&checkForErrorAndReport.errorCount;
  nonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)&terminalIdCounter);
  __range2._4_4_ = 0;
  sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    (&(this->UserLex).TokenLexemes);
  __range2._0_4_ = (int)sVar9 + 2;
  __end2 = std::
           vector<SGParser::Generator::StdGrammarParseHandler::ProductionData,_std::allocator<SGParser::Generator::StdGrammarParseHandler::ProductionData>_>
           ::begin(&data->Productions);
  prod = (ProductionData *)
         std::
         vector<SGParser::Generator::StdGrammarParseHandler::ProductionData,_std::allocator<SGParser::Generator::StdGrammarParseHandler::ProductionData>_>
         ::end(&data->Productions);
  do {
    bVar8 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<SGParser::Generator::StdGrammarParseHandler::ProductionData_*,_std::vector<SGParser::Generator::StdGrammarParseHandler::ProductionData,_std::allocator<SGParser::Generator::StdGrammarParseHandler::ProductionData>_>_>
                                *)&prod);
    if (!bVar8) {
      __end2_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&data->OrderedStartSymbols);
      symbol_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&data->OrderedStartSymbols);
      while (bVar8 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&symbol_3), bVar8) {
        inonTerminals._M_node =
             (_Base_ptr)
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2_1);
        local_4d0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     *)&terminalIdCounter,(key_type *)inonTerminals._M_node);
        local_4d8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    *)&terminalIdCounter);
        bVar8 = std::operator==(&local_4d0,&local_4d8);
        if (bVar8) {
          pmVar25 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    ::operator[](&data->ProductionStartSymbols,(key_type *)inonTerminals._M_node);
          sVar3 = *pmVar25;
          uVar26 = std::__cxx11::string::data();
          CreateSymbolMap::anon_class_16_2_e3ac8062::operator()
                    ((anon_class_16_2_e3ac8062 *)
                     &nonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count,sVar3,
                     "Undefined production starting symbol %s",uVar26);
        }
        else {
          ppVar27 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                    ::operator->(&local_4d0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (startSymbols,&ppVar27->second);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2_1);
      }
      bVar8 = checkForErrorAndReport.errorCount == (size_t *)0x0;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)&terminalIdCounter);
      return bVar8;
    }
    p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)__gnu_cxx::
                 __normal_iterator<SGParser::Generator::StdGrammarParseHandler::ProductionData_*,_std::vector<SGParser::Generator::StdGrammarParseHandler::ProductionData,_std::allocator<SGParser::Generator::StdGrammarParseHandler::ProductionData>_>_>
                 ::operator*(&__end2);
    Production::Production
              ((Production *)
               &rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &reduceData._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
    ::map((map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
           *)&precValue);
    local_1b0 = 0;
    iright._7_1_ = 0;
    right = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x20);
    line = p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x38;
    pmVar25 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::operator[](&data->ProductionLines,
                           (key_type *)
                           p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_node_count);
    local_1d8 = *pmVar25;
    for (left = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0; pvVar24 = left,
        pvVar10 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)line), pvVar24 < pvVar10;
        left = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&(left->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1)) {
      symbol._3_1_ = 0;
      local_1f0 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)line,(size_type)left);
      pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)local_1f0);
      if (*pcVar11 == '*') {
        iright._7_1_ = 1;
        break;
      }
      pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)local_1f0);
      if (*pcVar11 == '$') {
        std::__cxx11::string::substr((ulong)local_210,(ulong)local_1f0);
        std::__cxx11::string::operator=((string *)local_1f0,local_210);
        std::__cxx11::string::~string(local_210);
        symbol._3_1_ = 1;
      }
      uStack_1ac = 0xffffffff;
      pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)local_1f0);
      if (*pcVar11 == '\'') {
        std::__cxx11::string::substr((ulong)local_230,(ulong)local_1f0);
        std::__cxx11::string::operator=((string *)local_1f0,local_230);
        std::__cxx11::string::~string(local_230);
        local_238._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::find(&(this->UserLex).LexemeAliasToToken,local_1f0);
        local_240._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::end(&(this->UserLex).LexemeAliasToToken);
        bVar8 = std::operator!=(&local_238,&local_240);
        mVar6 = local_1d8;
        if (bVar8) {
          pmVar17 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    ::operator[](&(this->UserLex).LexemeAliasToToken,local_1f0);
          uStack_1ac = *pmVar17;
        }
        else {
          uVar26 = std::__cxx11::string::data();
          CreateSymbolMap::anon_class_16_2_e3ac8062::operator()
                    ((anon_class_16_2_e3ac8062 *)
                     &nonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count,mVar6,
                     "Undefined alias referenced - \'%s\'",uVar26);
        }
      }
      else {
        pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)local_1f0);
        if ((*pcVar11 == '%') &&
           (pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)local_1f0), *pcVar11 == '('))
        {
          local_248._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::find(symbols,local_1f0);
          local_250._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::end(symbols);
          bVar8 = std::operator==(&local_248,&local_250);
          if (bVar8) {
            uStack_1ac = (uint)__range2 | 0x40000000;
            __range2._0_4_ = (uint)__range2 + 1;
          }
          else {
            pmVar17 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      ::operator[](symbols,local_1f0);
            uStack_1ac = *pmVar17;
          }
        }
        else {
          local_258._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::find(&(this->UserLex).LexemeNameToToken,local_1f0);
          _id = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::end(&(this->UserLex).LexemeNameToToken);
          bVar8 = std::operator!=(&local_258,(_Self *)&id);
          if (bVar8) {
            pmVar17 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      ::operator[](&(this->UserLex).LexemeNameToToken,local_1f0);
            uStack_1ac = *pmVar17;
          }
          else {
            bVar8 = std::operator==(local_1f0,"%error");
            if (bVar8) {
              uStack_1ac = 0;
            }
            else {
              bVar8 = std::operator==(local_1f0,"%error_backtrack");
              if (bVar8) {
                uStack_1ac = 0x20000000;
              }
            }
          }
        }
      }
      index._7_1_ = 0;
      while( true ) {
        p_Var4 = &left->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ;
        puVar12 = (undefined1 *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)line);
        bVar8 = false;
        if ((undefined1 *)((long)&(p_Var4->_M_impl).super__Vector_impl_data._M_start + 1U) < puVar12
           ) {
          pvVar21 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)line,(size_type)
                                         ((long)&(left->
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start + 1));
          pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)pvVar21);
          bVar8 = true;
          if (*pcVar11 != '>') {
            pvVar21 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)line,(size_type)
                                           ((long)&(left->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 1));
            pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)pvVar21);
            bVar8 = *pcVar11 == '<';
          }
        }
        mVar6 = local_1d8;
        if (!bVar8) break;
        left = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&(left->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1);
        if (uStack_1ac == 0xffffffff) {
          index._7_1_ = 1;
        }
        else {
          s.field_2._8_8_ =
               std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &reduceData._M_t._M_impl.super__Rb_tree_header._M_node_count);
          pvVar21 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)line,(size_type)left);
          std::__cxx11::string::substr((ulong)local_290,(ulong)pvVar21);
          local_298._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       *)&terminalIdCounter,(key_type *)local_290);
          action = (ConflictAction *)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          *)&terminalIdCounter);
          bVar8 = std::operator==(&local_298,(_Self *)&action);
          if (bVar8) {
            pmVar17 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                    *)&terminalIdCounter,(key_type *)local_290);
            *pmVar17 = __range2._4_4_;
            __range2._4_4_ = __range2._4_4_ + 1;
          }
          pmVar17 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                  *)&terminalIdCounter,(key_type *)local_290);
          index._0_4_ = *pmVar17;
          local_2ac = s.field_2._8_4_;
          local_2a8 = std::
                      map<unsigned_int,_SGParser::Generator::Production::ConflictAction,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction>_>_>
                      ::operator[]((map<unsigned_int,_SGParser::Generator::Production::ConflictAction,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction>_>_>
                                    *)&p.LeftChain.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2ac
                                  );
          local_2b8._M_node =
               (_Base_ptr)
               std::
               map<unsigned_int,_SGParser::Generator::Production::ConflictAction::Action,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction::Action>_>_>
               ::find(&local_2a8->Actions,(key_type *)&index);
          local_2c0._M_node =
               (_Base_ptr)
               std::
               map<unsigned_int,_SGParser::Generator::Production::ConflictAction::Action,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction::Action>_>_>
               ::end(&local_2a8->Actions);
          bVar8 = std::operator!=(&local_2b8,&local_2c0);
          mVar6 = local_1d8;
          if (bVar8) {
            uVar26 = std::__cxx11::string::data();
            uVar13 = std::__cxx11::string::data();
            CreateSymbolMap::anon_class_16_2_e3ac8062::operator()
                      ((anon_class_16_2_e3ac8062 *)
                       &nonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count,mVar6,
                       "Multiple conflict actions on nonterminal %s before \'%s\'",uVar26,uVar13);
          }
          else {
            pvVar21 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)line,(size_type)left);
            pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)pvVar21);
            cVar2 = *pcVar11;
            pmVar14 = std::
                      map<unsigned_int,_SGParser::Generator::Production::ConflictAction::Action,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction::Action>_>_>
                      ::operator[](&local_2a8->Actions,(key_type *)&index);
            *pmVar14 = (uint)(cVar2 != '>');
          }
          std::__cxx11::string::~string((string *)local_290);
        }
      }
      if ((index._7_1_ & 1) != 0) {
        uVar26 = std::__cxx11::string::data();
        CreateSymbolMap::anon_class_16_2_e3ac8062::operator()
                  ((anon_class_16_2_e3ac8062 *)
                   &nonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count,mVar6,
                   "Conflict actions before nonterminal %s",uVar26);
      }
      if (uStack_1ac == 0xffffffff) {
        local_2d8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     *)&terminalIdCounter,local_1f0);
        local_2e0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    *)&terminalIdCounter);
        bVar8 = std::operator==(&local_2d8,&local_2e0);
        if (bVar8) {
          pmVar17 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                  *)&terminalIdCounter,local_1f0);
          *pmVar17 = __range2._4_4_;
          __range2._4_4_ = __range2._4_4_ + 1;
        }
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                *)&terminalIdCounter,local_1f0);
        uStack_1ac = *pmVar17;
      }
      else {
        uStack_1ac = uStack_1ac | 0x80000000;
        local_2c8._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_SGParser::Generator::Grammar::TerminalPrec,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Grammar::TerminalPrec>_>_>
             ::find(&(this->UserLex).Precedence,&stack0xfffffffffffffe54);
        local_2d0._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_SGParser::Generator::Grammar::TerminalPrec,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Grammar::TerminalPrec>_>_>
             ::end(&(this->UserLex).Precedence);
        bVar8 = std::operator!=(&local_2c8,&local_2d0);
        if (bVar8) {
          pmVar15 = std::
                    map<unsigned_int,_SGParser::Generator::Grammar::TerminalPrec,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Grammar::TerminalPrec>_>_>
                    ::operator[](&(this->UserLex).Precedence,&stack0xfffffffffffffe54);
          local_1b0 = pmVar15->Value & 0x3fffffff;
        }
        else {
          local_1b0 = 0;
        }
      }
      if ((symbol._3_1_ & 1) == 0) {
        local_2e8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::find(symbols,local_1f0);
        nonTerminalIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      ::end(symbols);
        bVar8 = std::operator==(&local_2e8,
                                (_Self *)&nonTerminalIds.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        uVar7 = uStack_1ac;
        if (bVar8) {
          pmVar17 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    ::operator[](symbols,local_1f0);
          *pmVar17 = uVar7;
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &reduceData._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   &stack0xfffffffffffffe54);
      }
    }
    if ((iright._7_1_ & 1) != 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &terminalIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ireduce);
      for (symbol_1 = (value_type *)left; pvVar5 = symbol_1,
          pvVar16 = (value_type *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)line), pvVar5 < pvVar16; symbol_1 = (value_type *)&symbol_1->field_0x1
          ) {
        local_330 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)line,(size_type)symbol_1);
        pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)local_330);
        if (*pcVar11 == '+') {
          std::__cxx11::string::substr((ulong)local_350,(ulong)local_330);
          std::__cxx11::string::operator=((string *)local_330,local_350);
          std::__cxx11::string::~string(local_350);
          pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)local_330);
          if (*pcVar11 == '\'') {
            std::__cxx11::string::substr((ulong)local_370,(ulong)local_330);
            std::__cxx11::string::operator=((string *)local_330,local_370);
            std::__cxx11::string::~string(local_370);
            local_378._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::find(&(this->UserLex).LexemeAliasToToken,local_330);
            local_380._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::end(&(this->UserLex).LexemeAliasToToken);
            bVar8 = std::operator!=(&local_378,&local_380);
            mVar6 = local_1d8;
            if (bVar8) {
              pmVar17 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        ::operator[](&(this->UserLex).LexemeAliasToToken,local_330);
              uStack_1ac = *pmVar17 | 0x80000000;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ireduce,
                         &stack0xfffffffffffffe54);
            }
            else {
              uVar26 = std::__cxx11::string::data();
              CreateSymbolMap::anon_class_16_2_e3ac8062::operator()
                        ((anon_class_16_2_e3ac8062 *)
                         &nonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count,mVar6,
                         "Undefined terminal alias referenced - \'%s\' inside of the %reduce()",
                         uVar26);
            }
          }
          else {
            local_388._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::find(&(this->UserLex).LexemeNameToToken,local_330);
            __range6 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       ::end(&(this->UserLex).LexemeNameToToken);
            bVar8 = std::operator!=(&local_388,(_Self *)&__range6);
            mVar6 = local_1d8;
            if (bVar8) {
              pmVar17 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        ::operator[](&(this->UserLex).LexemeNameToToken,local_330);
              uStack_1ac = *pmVar17 | 0x80000000;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ireduce,
                         &stack0xfffffffffffffe54);
            }
            else {
              uVar26 = std::__cxx11::string::data();
              CreateSymbolMap::anon_class_16_2_e3ac8062::operator()
                        ((anon_class_16_2_e3ac8062 *)
                         &nonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count,mVar6,
                         "Undefined terminal referenced - \'%s\' inside of the %reduce()",uVar26);
            }
          }
        }
        else {
          pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)local_330);
          if (*pcVar11 == '*') {
            ppuVar1 = &terminalIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
            __end6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1);
            iStack_3a8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1);
            while (bVar8 = __gnu_cxx::operator!=(&__end6,&stack0xfffffffffffffc58), bVar8) {
              puVar18 = __gnu_cxx::
                        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        ::operator*(&__end6);
              local_3ac = *puVar18;
              psVar19 = (set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)
                        std::
                        map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                        ::operator[]((map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                                      *)&precValue,&local_3ac);
              local_3b8._M_current =
                   (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                      &ireduce);
              local_3c0 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                             &ireduce);
              std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
              insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                        (psVar19,local_3b8,
                         (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          )local_3c0);
              __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator++(&__end6);
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &terminalIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ireduce);
            std::__cxx11::string::substr((ulong)local_3e0,(ulong)local_330);
            std::__cxx11::string::operator=((string *)local_330,local_3e0);
            std::__cxx11::string::~string(local_3e0);
          }
          local_3e8._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       *)&terminalIdCounter,local_330);
          __range4 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            *)&terminalIdCounter);
          bVar8 = std::operator==(&local_3e8,(_Self *)&__range4);
          if (bVar8) {
            pmVar17 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                    *)&terminalIdCounter,local_330);
            *pmVar17 = __range2._4_4_;
            __range2._4_4_ = __range2._4_4_ + 1;
          }
          pmVar17 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                  *)&terminalIdCounter,local_330);
          uStack_1ac = *pmVar17;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &terminalIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,&stack0xfffffffffffffe54);
        }
      }
      ppuVar1 = &terminalIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
      __end4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1);
      iStack_408 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1);
      while (bVar8 = __gnu_cxx::operator!=(&__end4,&stack0xfffffffffffffbf8), bVar8) {
        puVar18 = __gnu_cxx::
                  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator*(&__end4);
        local_40c = *puVar18;
        psVar19 = (set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)
                  std::
                  map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                  ::operator[]((map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                                *)&precValue,&local_40c);
        __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ireduce);
        __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ireduce);
        std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  (psVar19,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            )__first._M_current,
                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )__last._M_current);
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end4);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ireduce);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &terminalIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &leftSymbolErrorTerminal.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ileft);
    for (symbol_2 = (value_type *)0x0; pvVar5 = symbol_2,
        pvVar16 = (value_type *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(right), pvVar5 < pvVar16; symbol_2 = (value_type *)&symbol_2->field_0x1) {
      local_460 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](right,(size_type)symbol_2);
      local_468._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   *)&terminalIdCounter,local_460);
      local_470._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  *)&terminalIdCounter);
      bVar8 = std::operator!=(&local_468,&local_470);
      if (bVar8) {
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                *)&terminalIdCounter,local_460);
        uStack_1ac = *pmVar17;
      }
      else {
        uStack_1ac = __range2._4_4_;
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                *)&terminalIdCounter,local_460);
        uVar7 = uStack_1ac;
        *pmVar17 = __range2._4_4_;
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ::operator[](symbols,local_460);
        *pmVar17 = uVar7;
        __range2._4_4_ = __range2._4_4_ + 1;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &leftSymbolErrorTerminal.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&stack0xfffffffffffffe54);
      puVar12 = &symbol_2->field_0x1;
      puVar20 = (undefined1 *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(right);
      if (puVar12 < puVar20) {
        pvVar21 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](right,(size_type)&symbol_2->field_0x1);
        pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)pvVar21);
        if (*pcVar11 != '%') goto LAB_0017223f;
        pvVar21 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](right,(size_type)&symbol_2->field_0x1);
        local_480._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::find(symbols,pvVar21);
        local_488._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::end(symbols);
        bVar8 = std::operator==(&local_480,&local_488);
        if (bVar8) {
          local_724 = (uint)__range2 | 0x40000000;
          __range2._0_4_ = (uint)__range2 + 1;
        }
        else {
          pvVar21 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](right,(size_type)&symbol_2->field_0x1);
          pmVar17 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    ::operator[](symbols,pvVar21);
          local_724 = *pmVar17;
        }
        local_474 = local_724;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ileft,&local_474);
        symbol_2 = (value_type *)&symbol_2->field_0x1;
      }
      else {
LAB_0017223f:
        ileft_1._4_4_ = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ileft,
                   (value_type_conflict2 *)((long)&ileft_1 + 4));
      }
    }
    for (rght = (uint *)0x0;
        puVar22 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     &leftSymbolErrorTerminal.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage),
        rght < puVar22; rght = (uint *)((long)rght + 1)) {
      pvVar23 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &leftSymbolErrorTerminal.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(size_type)rght);
      uStack_1ac = *pvVar23;
      sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &reduceData._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (sVar9 == 0) {
        local_748 = (uint *)0x0;
      }
      else {
        local_748 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &reduceData._M_t._M_impl.super__Rb_tree_header._M_node_count,0);
      }
      sVar3 = p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_node_count;
      uVar7 = uStack_1ac;
      sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &reduceData._M_t._M_impl.super__Rb_tree_header._M_node_count);
      pmVar25 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ::operator[](&data->ProductionLines,
                             (key_type *)
                             p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_node_count);
      Production::SetProduction
                ((Production *)
                 &rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(String *)sVar3,uVar7,local_748,
                 (uint)sVar9,*pmVar25,local_1b0);
      pvVar23 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ileft,
                           (size_type)rght);
      p.Line._4_4_ = *pvVar23;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_node_count);
      for (__range2_1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)0x0;
          pvVar24 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  &leftSymbolErrorTerminal.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage),
          __range2_1 < pvVar24;
          __range2_1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&(__range2_1->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1)) {
        if (__range2_1 !=
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)rght) {
          pvVar23 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &leftSymbolErrorTerminal.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)__range2_1);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_node_count,pvVar23);
        }
      }
      std::
      map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
      ::clear((map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               *)&p.NotReported);
      if ((iright._7_1_ & 1) != 0) {
        std::
        map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
        ::operator=((map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                     *)&p.NotReported,
                    (map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                     *)&precValue);
      }
      if ((*(byte *)(p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x50) & 1)
          != 0) {
        p.Line._0_1_ = 1;
      }
      std::vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
      ::push_back(productions,
                  (value_type *)
                  &rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ileft);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &leftSymbolErrorTerminal.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::
    map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
    ::~map((map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
            *)&precValue);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &reduceData._M_t._M_impl.super__Rb_tree_header._M_node_count);
    Production::~Production
              ((Production *)
               &rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<SGParser::Generator::StdGrammarParseHandler::ProductionData_*,_std::vector<SGParser::Generator::StdGrammarParseHandler::ProductionData,_std::allocator<SGParser::Generator::StdGrammarParseHandler::ProductionData>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool StdGrammarParseData::CreateSymbolMap(StdGrammarParseHandler& data,
                                          std::map<String, unsigned>& symbols,
                                          std::vector<Production>& productions,
                                          std::vector<unsigned>& startSymbols) {
    size_t errorCount = 0u;

    // Check for an error and report if needed
    const auto checkForErrorAndReport = [&](size_t line, const char* text...) {
        if (Messages.GetMessageFlags() & ParseMessageBuffer::MessageError) {
            va_list argList;
            va_start(argList, text);
            const auto msgText = StringWithVAFormat(text, argList);
            va_end(argList);

            const ParseMessage msg{ParseMessage::ErrorMessage, "", msgText, 0u, line};
            Messages.AddMessage(msg);
        }
        ++errorCount;
    };

    std::map<String, unsigned> nonTerminals;

    // NonTerminal id counter
    auto idCounter         = 0u;
    // Terminal id counter - extra terminals will be added to handle %error(Name)
    auto terminalIdCounter = unsigned(UserLex.TokenLexemes.size()) + TokenCode::TokenFirstID;

    for (auto& prod: data.Productions) {
        Production                             p;
        std::vector<unsigned>                  rhs;
        std::map<unsigned, std::set<unsigned>> reduceData;
        unsigned symbolId;
        unsigned precValue   = 0u;
        bool     reduceValue = false;
        size_t   iright;
        auto&    left        = prod.Left;
        auto&    right       = prod.Right;
        size_t   line        = data.ProductionLines[prod.Name];

        // Form right hand side list
        for (iright = 0u; iright < right.size(); ++iright) {
            bool  prec   = false;
            auto& symbol = right[iright];

            // Check to see if it is the beginning of the reduce overrides
            if (symbol[0u] == '*') {
                reduceValue = true;
                break;
            }

            // Check for precedence
            if (symbol[0u] == '$') {
                // Eat precedence marker '$'
                symbol = symbol.substr(1u);
                prec   = true;
            }

            // Search to see if it is a terminal
            symbolId = NFA::InvalidLexeme;
            // Terminal alias references will have special ' marker up front
            if (symbol[0u] == '\'') {
                // Eat alias marker quote
                symbol = symbol.substr(1u);

                if (UserLex.LexemeAliasToToken.find(symbol) != UserLex.LexemeAliasToToken.end())
                    symbolId = UserLex.LexemeAliasToToken[symbol];
                else
                    // ERROR: Undefined alias referenced
                    checkForErrorAndReport(line, "Undefined alias referenced - '%s'",
                                           symbol.data());
            } else {
                // If symbol has a % in front of it, it must be one of %error( ) directives
                if (symbol[0u] == '%' && symbol[6u] == '(') {
                    // Must be %error(Name)
                    // Make an error terminal, and reference it
                    // Assign it an Id, so it will be stored as a terminal in Symbols
                    if (symbols.find(symbol) == symbols.end())
                        symbolId = terminalIdCounter++ | ProductionMask::ErrorTerminal;
                    else
                        symbolId = symbols[symbol];
                } else {
                    // Standard terminal processing
                    // See if this is a terminal name declared in expressions
                    if (UserLex.LexemeNameToToken.find(symbol) != UserLex.LexemeNameToToken.end())
                        symbolId = UserLex.LexemeNameToToken[symbol];
                    // Special terminal - error, code TokenCode::TCode::TokenError
                    else if (symbol == "%error")
                        symbolId = TokenCode::TokenError;
                    else if (symbol == "%error_backtrack")
                        symbolId = TokenCode::TokenError | ProductionMask::BacktrackError;
                    else {} // Otherwise it is an error
                }
            }

            // Read in any conflict actions
            bool conflictActionsError = false;

            while (iright + 1u < right.size() &&
                   (right[iright + 1u][0u] == '>' || right[iright + 1u][0u] == '<')) {
                ++iright;
                // Terminal must follow %shifton, %reduceon
                if (symbolId != NFA::InvalidLexeme) {
                    // Get nonterminal id
                    unsigned   id;
                    const auto index = rhs.size();
                    const auto s     = right[iright].substr(1u);

                    // Get Nonterminal Id
                    // If this nonterminal wasn't seen yet, assign it an id
                    if (nonTerminals.find(s) == nonTerminals.end())
                        nonTerminals[s] = idCounter++;
                    id = nonTerminals[s];

                    // Make sure there isn't an action on this nonterminal already
                    Production::ConflictAction & action = p.ConflictActions[unsigned(index)];
                    if (action.Actions.find(id) != action.Actions.end())
                        // Error: Multiple conflict
                        checkForErrorAndReport(line,
                                               "Multiple conflict actions on nonterminal %s before '%s'",
                                               s.data(), symbol.data());
                    else
                        // Store action
                        action.Actions[id] = right[iright][0u] == '>'
                                                 ? Production::ConflictAction::Action::Shift
                                                 : Production::ConflictAction::Action::Reduce;
                } else
                    // Conflict actions can only appear before a terminal
                    conflictActionsError = true;
            }

            // Conflict actions defined for nonterminal
            if (conflictActionsError)
                // Error: Multiple conflict actions
                checkForErrorAndReport(line, "Conflict actions before nonterminal %s",
                                       symbol.data());

            // Terminal - mark it with Terminal flag
            if (symbolId != NFA::InvalidLexeme) {
                symbolId |= ProductionMask::Terminal;

                // Get the precedence value
                if (UserLex.Precedence.find(symbolId) != UserLex.Precedence.end())
                    precValue = UserLex.Precedence[symbolId].Value &
                                Grammar::TerminalPrec::PrecMask;
                else
                    precValue = 0u;
            } else {
                // It's a nonterminal
                // If it's not defined yet, assign an Id to this nonterminal
                if (nonTerminals.find(symbol) == nonTerminals.end())
                    nonTerminals[symbol] = idCounter++;
                // And return Id to store
                symbolId = nonTerminals[symbol];
            }

            if (!prec) {
                // Make sure to add it to grammarSymbols
                if (symbols.find(symbol) == symbols.end())
                    symbols[symbol] = symbolId;

                // And store Id into production
                rhs.push_back(symbolId);
            }
        }

        // Build reduce overrides map
        if (reduceValue) {
            std::vector<unsigned> nonTerminalIds;
            std::vector<unsigned> terminalIds;

            for (auto ireduce = iright; ireduce < right.size(); ++ireduce) {
                auto& symbol = right[ireduce];

                // It is a terminal
                if (symbol[0u] == '+') {
                    symbol = symbol.substr(1u);
                    // Terminal alias references will have special ' marker up front
                    if (symbol[0u] == '\'') {
                        // Eat alias marker quote
                        symbol = symbol.substr(1u);

                        if (UserLex.LexemeAliasToToken.find(symbol) !=
                            UserLex.LexemeAliasToToken.end()) {
                            symbolId = UserLex.LexemeAliasToToken[symbol] |
                                       ProductionMask::Terminal;
                            terminalIds.push_back(symbolId);
                        } else
                            // ERROR: Undefined terminal alias referenced
                            checkForErrorAndReport(line,
                                                   "Undefined terminal alias referenced - '%s' inside of the %reduce()",
                                                   symbol.data());
                    } else if (UserLex.LexemeNameToToken.find(symbol) !=
                               UserLex.LexemeNameToToken.end()) {
                        symbolId = UserLex.LexemeNameToToken[symbol] | ProductionMask::Terminal;
                        terminalIds.push_back(symbolId);
                    } else
                        // ERROR: Undefined terminal referenced
                        checkForErrorAndReport(line,
                                               "Undefined terminal referenced - '%s' inside of the %reduce()",
                                               symbol.data());
                    continue;
                }

                // It is the first Nonterminal in the set
                if (symbol[0u] == '*') {
                    // store the last reduce data
                    for (const auto nonterm: nonTerminalIds)
                        reduceData[nonterm].insert(terminalIds.begin(), terminalIds.end());

                    // Reset the arrays
                    nonTerminalIds.clear();
                    terminalIds.clear();

                    // Eat the '*' marker
                    symbol = symbol.substr(1u);
                }

                // If it's not defined yet, assign an Id to this nonterminal
                if (nonTerminals.find(symbol) == nonTerminals.end())
                    nonTerminals[symbol] = idCounter++;
                // And return Id to store
                symbolId = nonTerminals[symbol];

                nonTerminalIds.push_back(symbolId);
            }

            // Store the last reduce data
            for (const auto nonterm: nonTerminalIds)
                reduceData[nonterm].insert(terminalIds.begin(), terminalIds.end());
        }

        // Build an array of LHS nonterminal symbol ids
        std::vector<unsigned> leftSymbolId;
        std::vector<unsigned> leftSymbolErrorTerminal;

        for (size_t ileft = 0u; ileft < left.size(); ++ileft) {
            // Store & get id for Left nonterminal
            const auto& symbol = left[ileft];

            if (nonTerminals.find(symbol) != nonTerminals.end())
                symbolId = nonTerminals[symbol];
            else {
                // Assign nonterminal Id
                symbolId = idCounter++;
                nonTerminals[symbol] = symbolId;
                // And record nonterminal symbol
                symbols[symbol]      = symbolId;
            }
            leftSymbolId.push_back(symbolId);

            // If we have associated %error
            if (ileft + 1u < left.size() && left[ileft + 1u][0u] == '%') {
                // Store error terminal's symbol id (might need to assign a new one)
                leftSymbolErrorTerminal.push_back(
                    symbols.find(left[ileft + 1u]) == symbols.end()
                        ? terminalIdCounter++ | ProductionMask::ErrorTerminal
                        : symbols[left[ileft + 1u]]);
                ++ileft;
            } else
                leftSymbolErrorTerminal.push_back(0);
        }

        // Store a production for all left hand side nonterminals
        for (size_t ileft = 0u; ileft < leftSymbolId.size(); ++ileft) {
            // Get the symbol id
            symbolId = leftSymbolId[ileft];

            // Finally store production value
            unsigned* const rght = rhs.size() ? &rhs[0] : nullptr;
            p.SetProduction(prod.Name, symbolId, rght, unsigned(rhs.size()),
                            data.ProductionLines[prod.Name], precValue);
            p.ErrorTerminal = leftSymbolErrorTerminal[ileft];

            // Build the left hand chain
            p.LeftChain.clear();
            for (size_t ichain = 0u; ichain < leftSymbolId.size(); ++ichain)
                // Make sure not to add the same nonterminal
                if (ichain != ileft)
                    p.LeftChain.push_back(leftSymbolId[ichain]);

            // Add the reduce overrides data
            p.ReduceOverrides.clear();
            if (reduceValue)
                p.ReduceOverrides = reduceData;

            // If its an action production don't report it
            if (prod.NotReported)
                p.NotReported = true;

            productions.push_back(p);
        }
    }

    // Process starting symbols
    for (const auto& symbol: data.OrderedStartSymbols)
        if (const auto inonTerminals = nonTerminals.find(symbol);
            inonTerminals == nonTerminals.end())
            // Error: Undefined production start symbol
            checkForErrorAndReport(data.ProductionStartSymbols[symbol],
                                   "Undefined production starting symbol %s", symbol.data());
        else
            // Store starting production's nonterminal Id
            startSymbols.push_back(inonTerminals->second);

    return errorCount == 0u;
}